

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O0

Aggregate * __thiscall hta::Aggregate::operator+=(Aggregate *this,Aggregate other)

{
  double *pdVar1;
  Aggregate *this_local;
  
  pdVar1 = std::min<double>(&other.minimum,&this->minimum);
  this->minimum = *pdVar1;
  pdVar1 = Catch::clara::std::max<double>(&other.maximum,&this->maximum);
  this->maximum = *pdVar1;
  this->sum = other.sum + this->sum;
  this->count = other.count + this->count;
  this->integral = other.integral + this->integral;
  std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this->active_time,&other.active_time);
  return this;
}

Assistant:

Aggregate& Aggregate::operator+=(Aggregate other)
{
    minimum = std::min(other.minimum, minimum);
    maximum = std::max(other.maximum, maximum);
    sum += other.sum;
    count += other.count;
    integral += other.integral;
    active_time += other.active_time;
    return *this;
}